

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O1

BinaryOp __thiscall
wasm::OptimizeInstructions::makeUnsignedBinaryOp(OptimizeInstructions *this,BinaryOp op)

{
  BinaryOp BVar1;
  
  if ((int)op < 0x11) {
    if (op == DivSInt32) {
      return DivUInt32;
    }
    if (op == RemSInt32) {
      return RemUInt32;
    }
    if (op == ShrSInt32) {
      return ShrUInt32;
    }
    goto switchD_00806214_caseD_12;
  }
  switch(op) {
  case LtSInt32:
    BVar1 = LtUInt32;
    break;
  case LtUInt32:
  case LeUInt32:
  case GtUInt32:
  case GeUInt32:
  case AddInt64:
  case SubInt64:
  case MulInt64:
  case DivUInt64:
    goto switchD_00806214_caseD_12;
  case LeSInt32:
    BVar1 = LeUInt32;
    break;
  case GtSInt32:
    BVar1 = GtUInt32;
    break;
  case GeSInt32:
    BVar1 = GeUInt32;
    break;
  case DivSInt64:
    BVar1 = DivUInt64;
    break;
  case RemSInt64:
    BVar1 = RemUInt64;
    break;
  default:
    switch(op) {
    case LtSInt64:
      BVar1 = LtUInt64;
      break;
    case LeSInt64:
      BVar1 = LeUInt64;
      break;
    case GtSInt64:
      BVar1 = GtUInt64;
      break;
    case GeSInt64:
      BVar1 = GeUInt64;
      break;
    default:
      if (op == ShrSInt64) {
        return ShrUInt64;
      }
    case LtUInt64:
    case LeUInt64:
    case GtUInt64:
switchD_00806214_caseD_12:
      BVar1 = InvalidBinary;
    }
  }
  return BVar1;
}

Assistant:

BinaryOp makeUnsignedBinaryOp(BinaryOp op) {
    switch (op) {
      case DivSInt32:
        return DivUInt32;
      case RemSInt32:
        return RemUInt32;
      case ShrSInt32:
        return ShrUInt32;
      case LtSInt32:
        return LtUInt32;
      case LeSInt32:
        return LeUInt32;
      case GtSInt32:
        return GtUInt32;
      case GeSInt32:
        return GeUInt32;

      case DivSInt64:
        return DivUInt64;
      case RemSInt64:
        return RemUInt64;
      case ShrSInt64:
        return ShrUInt64;
      case LtSInt64:
        return LtUInt64;
      case LeSInt64:
        return LeUInt64;
      case GtSInt64:
        return GtUInt64;
      case GeSInt64:
        return GeUInt64;

      default:
        return InvalidBinary;
    }
  }